

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mockaron.hpp
# Opt level: O1

void __thiscall
mockaron::detail::any::set<std::function<char_const*(int,char)>>
          (any *this,function<const_char_*(int,_char)> *v)

{
  _Manager_type p_Var1;
  undefined8 uVar2;
  undefined8 *puVar3;
  anon_class_1_0_00000001 local_11;
  
  puVar3 = (undefined8 *)operator_new(0x20);
  *puVar3 = 0;
  puVar3[1] = 0;
  puVar3[2] = 0;
  puVar3[3] = v->_M_invoker;
  p_Var1 = (v->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    uVar2 = *(undefined8 *)((long)&(v->super__Function_base)._M_functor + 8);
    *puVar3 = *(undefined8 *)&(v->super__Function_base)._M_functor;
    puVar3[1] = uVar2;
    puVar3[2] = p_Var1;
    (v->super__Function_base)._M_manager = (_Manager_type)0x0;
    v->_M_invoker = (_Invoker_type)0x0;
  }
  this->_ptr = puVar3;
  std::function<void(void*)>::operator=((function<void(void*)> *)&this->_deleter,&local_11);
  return;
}

Assistant:

void set(T&& v)
  {
    _ptr = new std::decay_t<T>(std::forward<T>(v));
    _deleter = [](void* ptr) { delete static_cast<T*>(ptr); };
  }